

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

mpack_node_t mpack_node_map_uint(mpack_node_t node,uint64_t num)

{
  mpack_node_data_t *pmVar1;
  mpack_tree_t *pmVar2;
  mpack_node_t mVar3;
  
  pmVar2 = node.tree;
  pmVar1 = mpack_node_map_uint_impl(node,num);
  if (pmVar1 == (mpack_node_data_t *)0x0) {
    if (pmVar2->error == mpack_ok) {
      pmVar2->error = mpack_error_data;
      if (pmVar2->error_fn != (mpack_tree_error_t)0x0) {
        (*pmVar2->error_fn)(pmVar2,mpack_error_data);
      }
    }
    pmVar1 = &pmVar2->nil_node;
  }
  mVar3.tree = pmVar2;
  mVar3.data = pmVar1;
  return mVar3;
}

Assistant:

mpack_node_t mpack_node_map_uint(mpack_node_t node, uint64_t num) {
    return mpack_node_wrap_lookup(node.tree, mpack_node_map_uint_impl(node, num));
}